

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

int __thiscall presolve::HPresolve::link(HPresolve *this,char *__from,char *__to)

{
  value_type vVar1;
  HighsLp *pHVar2;
  reference pvVar3;
  reference pvVar4;
  int iVar5;
  anon_class_8_1_8991fb9c get_row_key;
  anon_class_8_1_8991fb9c get_row_right;
  anon_class_8_1_8991fb9c get_row_left;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff50;
  vector<int,_std::allocator<int>_> *pvVar6;
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_stack_ffffffffffffff68;
  int iVar7;
  undefined8 in_stack_ffffffffffffff70;
  HighsInt linknode;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  HighsInt in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  HighsLinearSumBounds *this_01;
  
  linknode = (HighsInt)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  iVar5 = (int)__from;
  this_01 = (HighsLinearSumBounds *)&this->colhead;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Acol,(long)iVar5);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)this_01,(long)*pvVar3);
  vVar1 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Anext,(long)iVar5);
  *pvVar3 = vVar1;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Aprev,(long)iVar5);
  *pvVar3 = -1;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Acol,(long)iVar5);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->colhead,(long)*pvVar3);
  *pvVar3 = iVar5;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Anext,(long)iVar5);
  if (*pvVar3 != -1) {
    in_stack_ffffffffffffffa0 = &this->Aprev;
    in_stack_ffffffffffffffac = iVar5;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Anext,(long)iVar5);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (in_stack_ffffffffffffffa0,(long)*pvVar3);
    *pvVar3 = in_stack_ffffffffffffffac;
  }
  pvVar6 = &this->colsize;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Acol,(long)iVar5);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)*pvVar3);
  *pvVar3 = *pvVar3 + 1;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->ARleft,(long)iVar5);
  *pvVar3 = -1;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->ARright,(long)iVar5);
  *pvVar3 = -1;
  this_00 = &this->rowroot;
  iVar7 = iVar5;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Arow,(long)iVar5);
  std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar3);
  highs_splay_link<presolve::HPresolve::link(int)::__0&,presolve::HPresolve::link(int)::__1&,presolve::HPresolve::link(int)::__2&>
            (linknode,(HighsInt *)CONCAT44(iVar7,in_stack_ffffffffffffff68),
             (anon_class_8_1_8991fb9c *)this_00,(anon_class_8_1_8991fb9c *)pvVar6,
             in_stack_ffffffffffffff50);
  std::vector<int,_std::allocator<int>_>::operator[](&this->Arow,(long)iVar5);
  std::vector<int,_std::allocator<int>_>::operator[](&this->Acol,(long)iVar5);
  std::vector<double,_std::allocator<double>_>::operator[](&this->Avalue,(long)iVar5);
  HighsLinearSumBounds::add
            (this_01,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
             (double)in_stack_ffffffffffffffa0);
  std::vector<int,_std::allocator<int>_>::operator[](&this->Acol,(long)iVar5);
  std::vector<int,_std::allocator<int>_>::operator[](&this->Arow,(long)iVar5);
  std::vector<double,_std::allocator<double>_>::operator[](&this->Avalue,(long)iVar5);
  HighsLinearSumBounds::add
            (this_01,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
             (double)in_stack_ffffffffffffffa0);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Arow,(long)iVar5);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->rowsize,(long)*pvVar3);
  *pvVar3 = *pvVar3 + 1;
  pHVar2 = this->model;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Acol,(long)iVar5);
  pvVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                     (&pHVar2->integrality_,(long)*pvVar3);
  if (*pvVar4 == kInteger) {
    pvVar6 = &this->rowsizeInteger;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Arow,(long)iVar5);
    pvVar4 = (reference)std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)*pvVar3);
    *(undefined4 *)pvVar4 = *(undefined4 *)pvVar4 + kInteger;
  }
  else {
    pHVar2 = this->model;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Acol,(long)iVar5);
    pvVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                       (&pHVar2->integrality_,(long)*pvVar3);
    if (*pvVar4 == kImplicitInteger) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Arow,(long)iVar5);
      pvVar4 = (reference)
               std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->rowsizeImplInt,(long)*pvVar3);
      *(undefined4 *)pvVar4 = *(undefined4 *)pvVar4 + kInteger;
    }
  }
  return (int)pvVar4;
}

Assistant:

void HPresolve::link(HighsInt pos) {
  Anext[pos] = colhead[Acol[pos]];
  Aprev[pos] = -1;
  colhead[Acol[pos]] = pos;
  if (Anext[pos] != -1) Aprev[Anext[pos]] = pos;

  ++colsize[Acol[pos]];

  ARleft[pos] = -1;
  ARright[pos] = -1;
  auto get_row_left = [&](HighsInt pos) -> HighsInt& { return ARleft[pos]; };
  auto get_row_right = [&](HighsInt pos) -> HighsInt& { return ARright[pos]; };
  auto get_row_key = [&](HighsInt pos) { return Acol[pos]; };
  highs_splay_link(pos, rowroot[Arow[pos]], get_row_left, get_row_right,
                   get_row_key);

  impliedRowBounds.add(Arow[pos], Acol[pos], Avalue[pos]);
  impliedDualRowBounds.add(Acol[pos], Arow[pos], Avalue[pos]);
  ++rowsize[Arow[pos]];
  if (model->integrality_[Acol[pos]] == HighsVarType::kInteger)
    ++rowsizeInteger[Arow[pos]];
  else if (model->integrality_[Acol[pos]] == HighsVarType::kImplicitInteger)
    ++rowsizeImplInt[Arow[pos]];
}